

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

CSVLine * to_csv_line(CSVLine *__return_storage_ptr__,Repeat *repeat,string *sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,4);
  uVar2 = repeat->pos;
  cVar5 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar6 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00102a14;
      }
      if (uVar6 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00102a14;
      }
      if (uVar6 < 10000) goto LAB_00102a14;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00102a14:
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar2 = repeat->length;
  cVar5 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar6 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00102ab4;
      }
      if (uVar6 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00102ab4;
      }
      if (uVar6 < 10000) goto LAB_00102ab4;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00102ab4:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar2 = repeat->period;
  cVar5 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar6 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00102b4e;
      }
      if (uVar6 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00102b4e;
      }
      if (uVar6 < 10000) goto LAB_00102b4e;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00102b4e:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)sequence);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

CSVLine to_csv_line(const tandem::Repeat& repeat, const std::string& sequence)
{
    CSVLine result {};
    result.reserve(4);
    result.push_back(std::to_string(repeat.pos));
    result.push_back(std::to_string(repeat.length));
    result.push_back(std::to_string(repeat.period));
    result.push_back(sequence.substr(repeat.pos, repeat.period));
    return result;
}